

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::protobuf_google_2fprotobuf_2fdescriptor_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00428ee0 == '\x01') {
    DAT_00428ee0 = '\0';
    (*(code *)*_FileDescriptorSet_default_instance_)();
  }
  if (DAT_00429878 != (long *)0x0) {
    (**(code **)(*DAT_00429878 + 8))();
  }
  if (DAT_00428fc0 == '\x01') {
    DAT_00428fc0 = '\0';
    (*(code *)*_FileDescriptorProto_default_instance_)();
  }
  if (DAT_00429888 != (long *)0x0) {
    (**(code **)(*DAT_00429888 + 8))();
  }
  if (DAT_00428fe8 == '\x01') {
    DAT_00428fe8 = '\0';
    (*(code *)*_DescriptorProto_ExtensionRange_default_instance_)();
  }
  if (DAT_00429898 != (long *)0x0) {
    (**(code **)(*DAT_00429898 + 8))();
  }
  if (DAT_00429010 == '\x01') {
    DAT_00429010 = '\0';
    (*(code *)*_DescriptorProto_ReservedRange_default_instance_)();
  }
  if (DAT_004298a8 != (long *)0x0) {
    (**(code **)(*DAT_004298a8 + 8))();
  }
  if (DAT_00429100 == '\x01') {
    DAT_00429100 = '\0';
    (*(code *)*_DescriptorProto_default_instance_)();
  }
  if (DAT_004298b8 != (long *)0x0) {
    (**(code **)(*DAT_004298b8 + 8))();
  }
  if (DAT_00429160 == '\x01') {
    DAT_00429160 = '\0';
    (*(code *)*_FieldDescriptorProto_default_instance_)();
  }
  if (DAT_004298c8 != (long *)0x0) {
    (**(code **)(*DAT_004298c8 + 8))();
  }
  if (DAT_00429190 == '\x01') {
    DAT_00429190 = '\0';
    (*(code *)*_OneofDescriptorProto_default_instance_)();
  }
  if (DAT_004298d8 != (long *)0x0) {
    (**(code **)(*DAT_004298d8 + 8))();
  }
  if (DAT_004291d8 == '\x01') {
    DAT_004291d8 = '\0';
    (*(code *)*_EnumDescriptorProto_default_instance_)();
  }
  if (DAT_004298e8 != (long *)0x0) {
    (**(code **)(*DAT_004298e8 + 8))();
  }
  if (DAT_00429210 == '\x01') {
    DAT_00429210 = '\0';
    (*(code *)*_EnumValueDescriptorProto_default_instance_)();
  }
  if (DAT_004298f8 != (long *)0x0) {
    (**(code **)(*DAT_004298f8 + 8))();
  }
  if (DAT_00429258 == '\x01') {
    DAT_00429258 = '\0';
    (*(code *)*_ServiceDescriptorProto_default_instance_)();
  }
  if (DAT_00429908 != (long *)0x0) {
    (**(code **)(*DAT_00429908 + 8))();
  }
  if (DAT_004292a0 == '\x01') {
    DAT_004292a0 = '\0';
    (*(code *)*_MethodDescriptorProto_default_instance_)();
  }
  if (DAT_00429918 != (long *)0x0) {
    (**(code **)(*DAT_00429918 + 8))();
  }
  if (DAT_00429358 == '\x01') {
    DAT_00429358 = '\0';
    (*(code *)*_FileOptions_default_instance_)();
  }
  if (DAT_00429928 != (long *)0x0) {
    (**(code **)(*DAT_00429928 + 8))();
  }
  if (DAT_004293d0 == '\x01') {
    DAT_004293d0 = '\0';
    (*(code *)*_MessageOptions_default_instance_)();
  }
  if (DAT_00429938 != (long *)0x0) {
    (**(code **)(*DAT_00429938 + 8))();
  }
  if (DAT_00429450 == '\x01') {
    DAT_00429450 = '\0';
    (*(code *)*_FieldOptions_default_instance_)();
  }
  if (DAT_00429948 != (long *)0x0) {
    (**(code **)(*DAT_00429948 + 8))();
  }
  if (DAT_004294c0 == '\x01') {
    DAT_004294c0 = '\0';
    (*(code *)*_OneofOptions_default_instance_)();
  }
  if (DAT_00429958 != (long *)0x0) {
    (**(code **)(*DAT_00429958 + 8))();
  }
  if (DAT_00429538 == '\x01') {
    DAT_00429538 = '\0';
    (*(code *)*_EnumOptions_default_instance_)();
  }
  if (DAT_00429968 != (long *)0x0) {
    (**(code **)(*DAT_00429968 + 8))();
  }
  if (DAT_004295b0 == '\x01') {
    DAT_004295b0 = '\0';
    (*(code *)*_EnumValueOptions_default_instance_)();
  }
  if (DAT_00429978 != (long *)0x0) {
    (**(code **)(*DAT_00429978 + 8))();
  }
  if (DAT_00429628 == '\x01') {
    DAT_00429628 = '\0';
    (*(code *)*_ServiceOptions_default_instance_)();
  }
  if (DAT_00429988 != (long *)0x0) {
    (**(code **)(*DAT_00429988 + 8))();
  }
  if (DAT_004296a0 == '\x01') {
    DAT_004296a0 = '\0';
    (*(code *)*_MethodOptions_default_instance_)();
  }
  if (DAT_00429998 != (long *)0x0) {
    (**(code **)(*DAT_00429998 + 8))();
  }
  if (DAT_004296d0 == '\x01') {
    DAT_004296d0 = '\0';
    (*(code *)*_UninterpretedOption_NamePart_default_instance_)();
  }
  if (DAT_004299a8 != (long *)0x0) {
    (**(code **)(*DAT_004299a8 + 8))();
  }
  if (DAT_00429738 == '\x01') {
    DAT_00429738 = '\0';
    (*(code *)*_UninterpretedOption_default_instance_)();
  }
  if (DAT_004299b8 != (long *)0x0) {
    (**(code **)(*DAT_004299b8 + 8))();
  }
  if (DAT_004297b0 == '\x01') {
    DAT_004297b0 = '\0';
    (*(code *)*_SourceCodeInfo_Location_default_instance_)();
  }
  if (DAT_004299c8 != (long *)0x0) {
    (**(code **)(*DAT_004299c8 + 8))();
  }
  if (DAT_004297e8 == '\x01') {
    DAT_004297e8 = '\0';
    (*(code *)*_SourceCodeInfo_default_instance_)();
  }
  if (DAT_004299d8 != (long *)0x0) {
    (**(code **)(*DAT_004299d8 + 8))();
  }
  if (DAT_00429830 == '\x01') {
    DAT_00429830 = '\0';
    (*(code *)*_GeneratedCodeInfo_Annotation_default_instance_)();
  }
  if (DAT_004299e8 != (long *)0x0) {
    (**(code **)(*DAT_004299e8 + 8))();
  }
  if (DAT_00429868 == '\x01') {
    DAT_00429868 = '\0';
    (*(code *)*_GeneratedCodeInfo_default_instance_)();
  }
  if (DAT_004299f8 != (long *)0x0) {
    (**(code **)(*DAT_004299f8 + 8))();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _FileDescriptorSet_default_instance_.Shutdown();
  delete file_level_metadata[0].reflection;
  _FileDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[1].reflection;
  _DescriptorProto_ExtensionRange_default_instance_.Shutdown();
  delete file_level_metadata[2].reflection;
  _DescriptorProto_ReservedRange_default_instance_.Shutdown();
  delete file_level_metadata[3].reflection;
  _DescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[4].reflection;
  _FieldDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[5].reflection;
  _OneofDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[6].reflection;
  _EnumDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[7].reflection;
  _EnumValueDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[8].reflection;
  _ServiceDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[9].reflection;
  _MethodDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[10].reflection;
  _FileOptions_default_instance_.Shutdown();
  delete file_level_metadata[11].reflection;
  _MessageOptions_default_instance_.Shutdown();
  delete file_level_metadata[12].reflection;
  _FieldOptions_default_instance_.Shutdown();
  delete file_level_metadata[13].reflection;
  _OneofOptions_default_instance_.Shutdown();
  delete file_level_metadata[14].reflection;
  _EnumOptions_default_instance_.Shutdown();
  delete file_level_metadata[15].reflection;
  _EnumValueOptions_default_instance_.Shutdown();
  delete file_level_metadata[16].reflection;
  _ServiceOptions_default_instance_.Shutdown();
  delete file_level_metadata[17].reflection;
  _MethodOptions_default_instance_.Shutdown();
  delete file_level_metadata[18].reflection;
  _UninterpretedOption_NamePart_default_instance_.Shutdown();
  delete file_level_metadata[19].reflection;
  _UninterpretedOption_default_instance_.Shutdown();
  delete file_level_metadata[20].reflection;
  _SourceCodeInfo_Location_default_instance_.Shutdown();
  delete file_level_metadata[21].reflection;
  _SourceCodeInfo_default_instance_.Shutdown();
  delete file_level_metadata[22].reflection;
  _GeneratedCodeInfo_Annotation_default_instance_.Shutdown();
  delete file_level_metadata[23].reflection;
  _GeneratedCodeInfo_default_instance_.Shutdown();
  delete file_level_metadata[24].reflection;
}